

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall optimization::common_expr_del::Node::init_main_var(Node *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  Value *in_RDI;
  VarId var_1;
  iterator __end4;
  iterator __begin4;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range4;
  VarId var;
  iterator __end3;
  iterator __begin3;
  list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range3;
  Value *in_stack_fffffffffffffef8;
  VarId *in_stack_ffffffffffffff08;
  Env *in_stack_ffffffffffffff10;
  key_type_conflict *in_stack_ffffffffffffff18;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_stack_ffffffffffffff20;
  _Self local_a8;
  _Self local_a0;
  Value *local_98;
  char local_30 [16];
  _Self local_20;
  _Self local_18;
  bool *local_10;
  
  bVar1 = std::optional<mir::inst::Value>::has_value((optional<mir::inst::Value> *)0x179a45);
  if (bVar1) {
    std::optional<mir::inst::Value>::value((optional<mir::inst::Value> *)in_RDI);
    mir::inst::Value::operator=(in_RDI,in_stack_fffffffffffffef8);
  }
  else {
    local_10 = (bool *)&in_RDI[2].field_0x8;
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                   ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                    in_stack_fffffffffffffef8);
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                   ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                    in_stack_fffffffffffffef8);
    while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
      std::_List_iterator<mir::inst::VarId>::operator*((_List_iterator<mir::inst::VarId> *)0x179ad5)
      ;
      mir::inst::VarId::VarId((VarId *)in_RDI,(VarId *)in_stack_fffffffffffffef8);
      std::
      __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x179af1);
      pmVar2 = std::
               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
               ::at(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if ((pmVar2->is_phi_var & 1U) == 0) {
        mir::inst::VarId::VarId((VarId *)in_RDI,(VarId *)in_stack_fffffffffffffef8);
        mir::inst::Value::Value(in_RDI,(VarId *)in_stack_fffffffffffffef8);
        mir::inst::Value::operator=(in_RDI,in_stack_fffffffffffffef8);
        std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::remove
                  ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&in_RDI[2].field_0x8
                   ,local_30);
        return;
      }
      std::_List_iterator<mir::inst::VarId>::operator++(&local_18);
    }
    sVar3 = std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                      ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
    if (sVar3 == 0) {
      sVar3 = std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                        ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
      if (sVar3 != 0) {
        std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::front
                  ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
        mir::inst::VarId::VarId((VarId *)in_RDI,(VarId *)in_stack_fffffffffffffef8);
        mir::inst::Value::Value(in_RDI,(VarId *)in_stack_fffffffffffffef8);
        mir::inst::Value::operator=(in_RDI,in_stack_fffffffffffffef8);
        std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front
                  ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
      }
    }
    else {
      std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::front
                ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
      mir::inst::VarId::VarId((VarId *)in_RDI,(VarId *)in_stack_fffffffffffffef8);
      mir::inst::Value::Value(in_RDI,(VarId *)in_stack_fffffffffffffef8);
      mir::inst::Value::operator=(in_RDI,in_stack_fffffffffffffef8);
      std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::pop_front
                ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)in_RDI);
      local_98 = in_RDI + 3;
      local_a0._M_node =
           (_List_node_base *)
           std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                     ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                      in_stack_fffffffffffffef8);
      local_a8._M_node =
           (_List_node_base *)
           std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                     ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                      in_stack_fffffffffffffef8);
      while (bVar1 = std::operator!=(&local_a0,&local_a8), bVar1) {
        std::_List_iterator<mir::inst::VarId>::operator*
                  ((_List_iterator<mir::inst::VarId> *)0x179c32);
        mir::inst::VarId::VarId((VarId *)in_RDI,(VarId *)in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef8 =
             (Value *)std::
                      __shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<optimization::common_expr_del::Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x179c4b);
        mir::inst::VarId::VarId((VarId *)in_RDI,(VarId *)in_stack_fffffffffffffef8);
        Env::remove_var(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        std::_List_iterator<mir::inst::VarId>::operator++(&local_a0);
      }
    }
  }
  return;
}

Assistant:

void init_main_var() {
    if (value.has_value()
        // && value->index() == 0 ||
        //     value.has_value() && value->index() == 1 &&
        //         std::get<mir::inst::VarId>(value.value()).id > 10000
    ) {
      mainVar = value.value();
    } else {
      for (auto var : live_vars) {
        if (!env->func.variables.at(var.id).is_phi_var) {
          mainVar = var;
          live_vars.remove(var);
          return;
        }
      }
      if (local_vars.size()) {
        // assert(local_vars.size()); store inst has no dest
        mainVar = local_vars.front();
        local_vars.pop_front();
        for (auto var : local_vars) {
          env->remove_var(var);
        }
      } else if (live_vars.size()) {  // add new var (store op has no local or
                                      // live vars)
        // mainVar = env->copy_var(live_vars.front());
        mainVar = live_vars.front();
        live_vars.pop_front();
      }
    }
  }